

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Gia_Man_t * Gia_ManCofStructure(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  uint uVar3;
  Vec_Int_t *vRes;
  Vec_Wec_t *vCofs;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int **ppiVar6;
  ulong uVar7;
  Gia_Man_t *pNew;
  Gia_Man_t *local_40;
  Vec_Int_t *local_38;
  
  local_40 = (Gia_Man_t *)0x0;
  vRes = Gia_ManFindSharedInputs(p);
  if ((vRes == (Vec_Int_t *)0x0) ||
     (vCofs = Gia_ManFindCofs(p,vRes,&local_40), vCofs == (Vec_Wec_t *)0x0)) {
    Gia_ManStopP(&local_40);
    goto LAB_00223df3;
  }
  pVVar4 = Gia_ManFindEquivClasses(vCofs);
  if (pVVar4 == (Vec_Int_t *)0x0) {
LAB_00223d77:
    Gia_ManStopP(&local_40);
  }
  else {
    uVar5 = pVVar4->nSize;
    if ((ulong)uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *pVVar4->pArray;
      if (1 < (int)uVar5) {
        uVar7 = 1;
        do {
          uVar1 = pVVar4->pArray[uVar7];
          if ((int)uVar3 <= (int)uVar1) {
            uVar3 = uVar1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
    }
    uVar5 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
    if (uVar3 + 1 < 2) {
      uVar5 = uVar3 + 1;
    }
    if (vRes->nSize <= (int)uVar5) goto LAB_00223d77;
    Gia_ManFindDerive(local_40,p->vCos->nSize,vRes,vCofs,pVVar4);
    p_00 = local_40;
    local_40 = Gia_ManCleanup(local_40);
    Gia_ManStop(p_00);
  }
  iVar2 = vCofs->nCap;
  __ptr = vCofs->pArray;
  local_38 = pVVar4;
  if ((long)iVar2 < 1) {
    if (__ptr != (Vec_Int_t *)0x0) goto LAB_00223dc3;
  }
  else {
    ppiVar6 = &__ptr->pArray;
    uVar7 = 0;
    do {
      if (*ppiVar6 != (int *)0x0) {
        free(*ppiVar6);
        *ppiVar6 = (int *)0x0;
      }
      uVar7 = uVar7 + 1;
      ppiVar6 = ppiVar6 + 2;
    } while (uVar7 < (ulong)(long)iVar2);
LAB_00223dc3:
    free(__ptr);
  }
  free(vCofs);
  pVVar4 = local_38;
  if (local_38 != (Vec_Int_t *)0x0) {
    if (local_38->pArray != (int *)0x0) {
      free(local_38->pArray);
    }
    free(pVVar4);
  }
LAB_00223df3:
  if (vRes != (Vec_Int_t *)0x0) {
    if (vRes->pArray != (int *)0x0) {
      free(vRes->pArray);
    }
    free(vRes);
  }
  return local_40;
}

Assistant:

Gia_Man_t * Gia_ManCofStructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vIns = Gia_ManFindSharedInputs( p );
    Vec_Wec_t * vCfs = vIns ? Gia_ManFindCofs( p, vIns, &pNew ) : NULL;
    Vec_Int_t * vMap = vCfs ? Gia_ManFindEquivClasses( vCfs ) : NULL;
    if ( vMap && Abc_Base2Log(Vec_IntFindMax(vMap)+1) < Vec_IntSize(vIns) ) 
    {
        Gia_Man_t * pTemp; 
        Gia_ManFindDerive( pNew, Gia_ManCoNum(p), vIns, vCfs, vMap );
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    else
        Gia_ManStopP( &pNew );
    Vec_WecFreeP( &vCfs );
    Vec_IntFreeP( &vMap );
    Vec_IntFreeP( &vIns );
    return pNew;
}